

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall CConfigManager::Init(CConfigManager *this,int FlagMask)

{
  IKernel *pIVar1;
  IConsole *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pIVar1 = (this->super_IConfigManager).super_IInterface.m_pKernel;
  iVar3 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"storage");
  this->m_pStorage = (IStorage *)CONCAT44(extraout_var,iVar3);
  pIVar1 = (this->super_IConfigManager).super_IInterface.m_pKernel;
  iVar3 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"console");
  this->m_pConsole = (IConsole *)CONCAT44(extraout_var_00,iVar3);
  this->m_FlagMask = FlagMask;
  (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[3])(this);
  pIVar2 = this->m_pConsole;
  if (pIVar2 != (IConsole *)0x0) {
    (*(pIVar2->super_IInterface)._vptr_IInterface[8])
              (pIVar2,"save_config","?s[file]",0xe,Con_SaveConfig,this,"Save config to file");
  }
  return;
}

Assistant:

void CConfigManager::Init(int FlagMask)
{
	m_pStorage = Kernel()->RequestInterface<IStorage>();
	m_pConsole = Kernel()->RequestInterface<IConsole>();
	m_FlagMask = FlagMask;
	Reset();

	if(m_pConsole)
		m_pConsole->Register("save_config", "?s[file]", CFGFLAG_SERVER|CFGFLAG_CLIENT|CFGFLAG_STORE, Con_SaveConfig, this, "Save config to file");
}